

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

bool embree::test_location
               (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                *in,ssize_t ipos,
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               *out,ssize_t opos)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  int iVar7;
  size_type sVar8;
  long in_RCX;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_RDX;
  long in_RSI;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_RDI;
  size_t k;
  ssize_t j;
  ssize_t i;
  __m128 mask_1;
  __m128 mask;
  ulong local_558;
  ulong uStack_550;
  ulong local_548;
  ulong uStack_540;
  undefined1 local_538 [16];
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  ulong local_4e8;
  ulong uStack_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  ulong local_4b0;
  long local_4a8;
  long local_4a0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_490;
  long local_488;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_480;
  bool local_471;
  reference local_470;
  long local_468;
  const_reference local_460;
  long local_458;
  const_reference local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_438;
  undefined4 local_42c;
  undefined8 *local_428;
  long local_420;
  reference local_418;
  long local_410;
  reference local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  ulong *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  ulong *local_3d8;
  undefined8 *local_3d0;
  ulong *local_3c8;
  ulong *local_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  ulong *local_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  ulong *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_328;
  ulong *local_320;
  ulong *local_318;
  undefined1 *local_310;
  undefined1 local_308 [16];
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  Vec3fx *local_2d8;
  ulong *local_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  Vec3fx *local_298;
  ulong *local_290;
  ulong local_288;
  ulong uStack_280;
  ulong *local_270;
  ulong *local_268;
  undefined8 *local_260;
  ulong *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined4 local_1f4;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  ulong uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  ulong local_28;
  ulong uStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_4a8 = in_RCX;
  local_4a0 = in_RSI;
  local_490 = in_RDX;
  local_488 = in_RSI;
  local_480 = in_RDI;
  if (in_RCX < 0) {
    local_471 = false;
  }
  else {
    while( true ) {
      lVar6 = local_4a8;
      bVar1 = false;
      if (local_4a0 < local_488 + 4) {
        local_470 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_490,0);
        bVar1 = lVar6 < (long)local_470->size_active;
      }
      if (!bVar1) break;
      for (local_4b0 = 0; uVar5 = local_4b0,
          sVar8 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::size(local_480), uVar5 < sVar8; local_4b0 = local_4b0 + 1) {
        local_450 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_480,local_4b0);
        local_458 = local_4a0;
        local_378 = *(undefined8 *)&local_450->items[local_4a0].field_0;
        uStack_370 = *(undefined8 *)((long)&local_450->items[local_4a0].field_0 + 8);
        local_360 = &local_4f8;
        local_4f8 = local_378;
        uStack_4f0 = uStack_370;
        local_408 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_490,local_4b0);
        local_410 = local_4a8;
        local_358 = *(undefined8 *)&local_408->items[local_4a8].field_0;
        uStack_350 = *(undefined8 *)((long)&local_408->items[local_4a8].field_0 + 8);
        local_400 = &local_508;
        local_3f0 = &local_4e8;
        local_198._0_4_ = (float)local_4f8;
        local_198._4_4_ = (float)((ulong)local_4f8 >> 0x20);
        uStack_190._0_4_ = (float)uStack_4f0;
        uStack_190._4_4_ = (float)((ulong)uStack_4f0 >> 0x20);
        local_1a8._0_4_ = (float)local_358;
        local_1a8._4_4_ = (float)((ulong)local_358 >> 0x20);
        uStack_1a0._0_4_ = (float)uStack_350;
        uStack_1a0._4_4_ = (float)((ulong)uStack_350 >> 0x20);
        local_398 = (float)local_198 - (float)local_1a8;
        fStack_394 = local_198._4_4_ - local_1a8._4_4_;
        fStack_390 = (float)uStack_190 - (float)uStack_1a0;
        fStack_38c = uStack_190._4_4_ - uStack_1a0._4_4_;
        local_d8 = CONCAT44(fStack_394,local_398);
        uStack_d0 = CONCAT44(fStack_38c,fStack_390);
        local_8c = 0x7fffffff;
        local_6c = 0x7fffffff;
        local_70 = 0x7fffffff;
        local_74 = 0x7fffffff;
        local_78 = 0x7fffffff;
        local_e8 = 0x7fffffff7fffffff;
        uStack_e0 = 0x7fffffff7fffffff;
        local_3b8 = local_d8 & 0x7fffffff7fffffff;
        uStack_3b0 = uStack_d0 & 0x7fffffff7fffffff;
        local_3f8 = &local_4f8;
        local_3c8 = local_3f0;
        local_3c0 = &local_4d8;
        local_3a0 = &local_4d8;
        local_380 = local_3f0;
        local_340 = local_400;
        local_268 = local_3f0;
        local_250 = local_400;
        local_248 = &local_4f8;
        local_1a8 = local_358;
        uStack_1a0 = uStack_350;
        local_198 = local_4f8;
        uStack_190 = uStack_4f0;
        local_a8 = local_e8;
        uStack_a0 = uStack_e0;
        local_88 = local_e8;
        uStack_80 = uStack_e0;
        local_508 = local_358;
        uStack_500 = uStack_350;
        local_4e8 = local_d8;
        uStack_4e0 = uStack_d0;
        local_4d8 = local_3b8;
        uStack_4d0 = uStack_3b0;
        local_460 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_480,local_4b0);
        local_468 = local_4a0;
        local_298 = local_460->items + local_4a0;
        local_94 = 0x7fffffff;
        local_2c = 0x7fffffff;
        local_30 = 0x7fffffff;
        local_34 = 0x7fffffff;
        local_38 = 0x7fffffff;
        local_2a8 = 0x7fffffff7fffffff;
        uStack_2a0 = 0x7fffffff7fffffff;
        local_118 = *(ulong *)&local_298->field_0;
        uStack_110 = *(ulong *)((long)&local_298->field_0 + 8);
        local_288 = local_118 & 0x7fffffff7fffffff;
        uStack_280 = uStack_110 & 0x7fffffff7fffffff;
        local_290 = &local_548;
        local_270 = &local_548;
        local_128 = local_2a8;
        uStack_120 = uStack_2a0;
        local_c8 = local_2a8;
        uStack_c0 = uStack_2a0;
        local_48 = local_2a8;
        uStack_40 = uStack_2a0;
        local_548 = local_288;
        uStack_540 = uStack_280;
        local_418 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](local_490,local_4b0);
        local_420 = local_4a8;
        local_2d8 = local_418->items + local_4a8;
        local_320 = &local_558;
        local_90 = 0x7fffffff;
        local_4c = 0x7fffffff;
        local_50 = 0x7fffffff;
        local_54 = 0x7fffffff;
        local_58 = 0x7fffffff;
        local_2e8 = 0x7fffffff7fffffff;
        uStack_2e0 = 0x7fffffff7fffffff;
        local_f8 = *(ulong *)&local_2d8->field_0;
        uStack_f0 = *(ulong *)((long)&local_2d8->field_0 + 8);
        local_2c8 = local_f8 & 0x7fffffff7fffffff;
        uStack_2c0 = uStack_f0 & 0x7fffffff7fffffff;
        local_310 = local_538;
        local_18 = local_548;
        uStack_10 = uStack_540;
        auVar3._8_8_ = uStack_540;
        auVar3._0_8_ = local_548;
        auVar2._8_8_ = uStack_2c0;
        auVar2._0_8_ = local_2c8;
        local_308 = maxps(auVar3,auVar2);
        local_438 = &local_528;
        local_338 = local_308._0_8_;
        uStack_330 = local_308._8_8_;
        local_528 = local_308._0_8_;
        uStack_520 = local_308._8_8_;
        local_428 = &local_518;
        local_42c = 0x3c23d70a;
        local_238 = &local_448;
        local_1f4 = 0x3c23d70a;
        local_1ac = 0x3c23d70a;
        local_1c8 = 0x3c23d70a;
        uStack_1c4 = 0x3c23d70a;
        uStack_1c0 = 0x3c23d70a;
        uStack_1bc = 0x3c23d70a;
        local_448 = 0x3c23d70a3c23d70a;
        uStack_440 = 0x3c23d70a3c23d70a;
        local_1d8 = 0x3c23d70a3c23d70a;
        uStack_1d0 = 0x3c23d70a3c23d70a;
        local_1e8._0_4_ = local_308._0_4_;
        local_1e8._4_4_ = local_308._4_4_;
        uStack_1e0._0_4_ = local_308._8_4_;
        uStack_1e0._4_4_ = local_308._12_4_;
        local_228 = (float)local_1e8 * 0.01;
        fStack_224 = local_1e8._4_4_ * 0.01;
        fStack_220 = (float)uStack_1e0 * 0.01;
        fStack_21c = uStack_1e0._4_4_ * 0.01;
        local_168 = CONCAT44(fStack_224,local_228);
        uStack_160 = CONCAT44(fStack_21c,fStack_220);
        local_3d0 = &local_4c8;
        local_158._0_4_ = (float)local_4d8;
        local_158._4_4_ = (float)(local_4d8 >> 0x20);
        uStack_150._0_4_ = (float)uStack_4d0;
        uStack_150._4_4_ = (float)(uStack_4d0 >> 0x20);
        local_148 = -(uint)(local_228 < (float)local_158);
        iStack_144 = -(uint)(fStack_224 < local_158._4_4_);
        iStack_140 = -(uint)(fStack_220 < (float)uStack_150);
        iStack_13c = -(uint)(fStack_21c < uStack_150._4_4_);
        local_130 = &local_4c8;
        local_188 = CONCAT44(iStack_144,local_148);
        uStack_180 = CONCAT44(iStack_13c,iStack_140);
        local_3e8 = &local_4c8;
        auVar4._8_8_ = uStack_180;
        auVar4._0_8_ = local_188;
        iVar7 = movmskps((int)local_3e8,auVar4);
        if (iVar7 != 0) {
          return false;
        }
        local_3e0 = local_428;
        local_3d8 = &local_4d8;
        local_328 = local_438;
        local_318 = &local_548;
        local_2f0 = local_310;
        local_2d0 = local_320;
        local_2b0 = local_320;
        local_260 = local_428;
        local_258 = &local_4d8;
        local_240 = local_438;
        local_230 = local_428;
        local_210 = local_428;
        local_208 = local_438;
        local_200 = local_238;
        local_1f0 = local_238;
        local_1e8 = local_308._0_8_;
        uStack_1e0 = local_308._8_8_;
        local_170 = local_3e8;
        local_158 = local_4d8;
        uStack_150 = uStack_4d0;
        local_108 = local_2e8;
        uStack_100 = uStack_2e0;
        local_b8 = local_2e8;
        uStack_b0 = uStack_2e0;
        local_68 = local_2e8;
        uStack_60 = uStack_2e0;
        local_28 = local_2c8;
        uStack_20 = uStack_2c0;
        local_558 = local_2c8;
        uStack_550 = uStack_2c0;
        local_518 = local_168;
        uStack_510 = uStack_160;
        local_4c8 = local_188;
        uStack_4c0 = uStack_180;
      }
      local_4a0 = local_4a0 + 1;
      local_4a8 = local_4a8 + 1;
    }
    local_471 = true;
  }
  return local_471;
}

Assistant:

bool test_location(const std::vector<avector<Vec3ff>>& in, ssize_t ipos, std::vector<avector<Vec3ff>>& out, ssize_t opos)
  {
    if (opos < 0) 
      return false;

    for (ssize_t i=ipos, j=opos; i<ipos+4 && j<(ssize_t)out[0].size(); i++, j++) {
      for (size_t k=0; k<in.size(); k++) {
        if (any(abs((vfloat4)in[k][i].m128-(vfloat4)out[k][j].m128) > 0.01f*(vfloat4)max(abs(in[k][i]),abs(out[k][j])).m128))
          return false;
      }
    }
    return true;
  }